

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_cas_8_ai(void)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar6 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar6 = pmmu_translate_addr(uVar6);
  }
  uVar3 = m68k_read_memory_16(uVar6 & m68ki_cpu.address_mask);
  uVar6 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar4 = uVar6;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar6);
  }
  uVar5 = m68k_read_memory_8(uVar4 & m68ki_cpu.address_mask);
  uVar2 = m68ki_cpu.dar[uVar3 & 7];
  m68ki_cpu.n_flag = uVar5 - (uVar2 & 0xff);
  m68ki_cpu.v_flag = (m68ki_cpu.n_flag ^ uVar5) & (uVar2 ^ uVar5);
  m68ki_cpu.not_z_flag = m68ki_cpu.n_flag & 0xff;
  m68ki_cpu.c_flag = m68ki_cpu.n_flag;
  if (m68ki_cpu.not_z_flag != 0) {
    m68ki_cpu.dar[uVar3 & 7] = uVar2 & 0xffffff00 | uVar5;
    return;
  }
  m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
  bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 4 & 0x1c));
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar6 = pmmu_translate_addr(uVar6);
  }
  m68k_write_memory_8(uVar6 & m68ki_cpu.address_mask,(uint)bVar1);
  return;
}

Assistant:

static void m68k_op_cas_8_ai(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint ea = EA_AY_AI_8();
		uint dest = m68ki_read_8(ea);
		uint* compare = &REG_D[word2 & 7];
		uint res = dest - MASK_OUT_ABOVE_8(*compare);

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_8(res);
		FLAG_Z = MASK_OUT_ABOVE_8(res);
		FLAG_V = VFLAG_SUB_8(*compare, dest, res);
		FLAG_C = CFLAG_8(res);

        if(COND_NE()) {
			*compare = MASK_OUT_BELOW_8(*compare) | dest;
        }
        else
		{
			USE_CYCLES(3);
			m68ki_write_8(ea, MASK_OUT_ABOVE_8(REG_D[(word2 >> 6) & 7]));
		}
		return;
	}
	m68ki_exception_illegal();
}